

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_free_hash_table.h
# Opt level: O2

void __thiscall
neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::
LockFreeHashTable(LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>
                  *this,size_t expectedThreadCount,size_t expectedDataNum)

{
  pointer pNVar1;
  long lVar2;
  ulong uVar3;
  DataNode *node;
  uint uVar4;
  ulong uVar5;
  size_t j;
  ulong uVar6;
  allocator_type local_41;
  ulong local_40;
  ulong local_38;
  
  std::
  vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>
  ::vector(&this->data_pool_,expectedThreadCount + 2,&local_41);
  local_40 = expectedThreadCount;
  FASTER::core::LightEpoch::LightEpoch(&(this->epoch_).inner_epoch_,(uint32_t)expectedThreadCount);
  for (lVar2 = 0x1840; lVar2 != 0x2040; lVar2 = lVar2 + 8) {
    LOCK();
    *(undefined8 *)((long)(this->epoch_).inner_epoch_.drain_list_ + lVar2 + -0x28) = 0;
    UNLOCK();
  }
  this->maxLevel_ = 0x14;
  this->maxElement_ = 0;
  uVar3 = expectedDataNum / local_40;
  uVar4 = 0;
  while (uVar5 = (ulong)uVar4, uVar5 < local_40) {
    local_38 = uVar5;
    for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 1) {
      pNVar1 = (this->data_pool_).
               super__Vector_base<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      node = (DataNode *)malloc(0x38);
      NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
      ::Push(pNVar1 + uVar5,node);
    }
    uVar4 = (int)local_38 + 1;
  }
  return;
}

Assistant:

explicit LockFreeHashTable(size_t expectedThreadCount, size_t expectedDataNum = 1000000) :
            epoch_(expectedThreadCount),
            data_pool_(expectedThreadCount + 2) {
        for (std::atomic<Node *> &ptr : root_)
            ptr.store(nullptr);
        size_t m = 1, num = kArraySize, level = 1;
        size_t total_bit = sizeof(Key) * 8;
        if (total_bit <= 64) {
            for (size_t i = 0; i < total_bit; i++)
                m *= 2;
            for (; num < m; num += num * kArraySize)
                level++;
            level++;
        }
        maxLevel_ = 20;
        maxElement_ = m;

        size_t each = expectedDataNum / expectedThreadCount;
        for (uint32_t i = 0; i < expectedThreadCount; i++) {
            for (size_t j = 0; j < each; j++) {
                data_pool_[i].Push((DataNode *) malloc(sizeof(DataNode)));
            }
        }
    }